

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void createKeyTables(void)

{
  int iVar1;
  long lVar2;
  XkbDescPtr desc;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char name [5];
  int key;
  int scancode;
  
  memset(_glfw.x11.keycodes,0xff,0x200);
  memset(_glfw.x11.scancodes,0xff,0x2ba);
  if (_glfw.x11.xkb.available != 0) {
    lVar2 = XkbGetMap(_glfw.x11.display,0,0x100);
    XkbGetNames(_glfw.x11.display,0x200,lVar2);
    for (name._1_4_ = ZEXT14(*(byte *)(lVar2 + 0xc));
        (int)name._1_4_ <= (int)(uint)*(byte *)(lVar2 + 0xd); name._1_4_ = name._1_4_ + 1) {
      desc._3_4_ = *(undefined4 *)
                    (*(long *)(*(long *)(lVar2 + 0x30) + 0x1c8) + (long)(int)name._1_4_ * 4);
      desc._7_1_ = 0;
      iVar1 = strcmp((char *)((long)&desc + 3),"TLDE");
      if (iVar1 == 0) {
        cStack_10 = '`';
        cStack_f = '\0';
        cStack_e = '\0';
        name[0] = '\0';
      }
      else {
        iVar1 = strcmp((char *)((long)&desc + 3),"AE01");
        if (iVar1 == 0) {
          cStack_10 = '1';
          cStack_f = '\0';
          cStack_e = '\0';
          name[0] = '\0';
        }
        else {
          iVar1 = strcmp((char *)((long)&desc + 3),"AE02");
          if (iVar1 == 0) {
            cStack_10 = '2';
            cStack_f = '\0';
            cStack_e = '\0';
            name[0] = '\0';
          }
          else {
            iVar1 = strcmp((char *)((long)&desc + 3),"AE03");
            if (iVar1 == 0) {
              cStack_10 = '3';
              cStack_f = '\0';
              cStack_e = '\0';
              name[0] = '\0';
            }
            else {
              iVar1 = strcmp((char *)((long)&desc + 3),"AE04");
              if (iVar1 == 0) {
                cStack_10 = '4';
                cStack_f = '\0';
                cStack_e = '\0';
                name[0] = '\0';
              }
              else {
                iVar1 = strcmp((char *)((long)&desc + 3),"AE05");
                if (iVar1 == 0) {
                  cStack_10 = '5';
                  cStack_f = '\0';
                  cStack_e = '\0';
                  name[0] = '\0';
                }
                else {
                  iVar1 = strcmp((char *)((long)&desc + 3),"AE06");
                  if (iVar1 == 0) {
                    cStack_10 = '6';
                    cStack_f = '\0';
                    cStack_e = '\0';
                    name[0] = '\0';
                  }
                  else {
                    iVar1 = strcmp((char *)((long)&desc + 3),"AE07");
                    if (iVar1 == 0) {
                      cStack_10 = '7';
                      cStack_f = '\0';
                      cStack_e = '\0';
                      name[0] = '\0';
                    }
                    else {
                      iVar1 = strcmp((char *)((long)&desc + 3),"AE08");
                      if (iVar1 == 0) {
                        cStack_10 = '8';
                        cStack_f = '\0';
                        cStack_e = '\0';
                        name[0] = '\0';
                      }
                      else {
                        iVar1 = strcmp((char *)((long)&desc + 3),"AE09");
                        if (iVar1 == 0) {
                          cStack_10 = '9';
                          cStack_f = '\0';
                          cStack_e = '\0';
                          name[0] = '\0';
                        }
                        else {
                          iVar1 = strcmp((char *)((long)&desc + 3),"AE10");
                          if (iVar1 == 0) {
                            cStack_10 = '0';
                            cStack_f = '\0';
                            cStack_e = '\0';
                            name[0] = '\0';
                          }
                          else {
                            iVar1 = strcmp((char *)((long)&desc + 3),"AE11");
                            if (iVar1 == 0) {
                              cStack_10 = '-';
                              cStack_f = '\0';
                              cStack_e = '\0';
                              name[0] = '\0';
                            }
                            else {
                              iVar1 = strcmp((char *)((long)&desc + 3),"AE12");
                              if (iVar1 == 0) {
                                cStack_10 = '=';
                                cStack_f = '\0';
                                cStack_e = '\0';
                                name[0] = '\0';
                              }
                              else {
                                iVar1 = strcmp((char *)((long)&desc + 3),"AD01");
                                if (iVar1 == 0) {
                                  cStack_10 = 'Q';
                                  cStack_f = '\0';
                                  cStack_e = '\0';
                                  name[0] = '\0';
                                }
                                else {
                                  iVar1 = strcmp((char *)((long)&desc + 3),"AD02");
                                  if (iVar1 == 0) {
                                    cStack_10 = 'W';
                                    cStack_f = '\0';
                                    cStack_e = '\0';
                                    name[0] = '\0';
                                  }
                                  else {
                                    iVar1 = strcmp((char *)((long)&desc + 3),"AD03");
                                    if (iVar1 == 0) {
                                      cStack_10 = 'E';
                                      cStack_f = '\0';
                                      cStack_e = '\0';
                                      name[0] = '\0';
                                    }
                                    else {
                                      iVar1 = strcmp((char *)((long)&desc + 3),"AD04");
                                      if (iVar1 == 0) {
                                        cStack_10 = 'R';
                                        cStack_f = '\0';
                                        cStack_e = '\0';
                                        name[0] = '\0';
                                      }
                                      else {
                                        iVar1 = strcmp((char *)((long)&desc + 3),"AD05");
                                        if (iVar1 == 0) {
                                          cStack_10 = 'T';
                                          cStack_f = '\0';
                                          cStack_e = '\0';
                                          name[0] = '\0';
                                        }
                                        else {
                                          iVar1 = strcmp((char *)((long)&desc + 3),"AD06");
                                          if (iVar1 == 0) {
                                            cStack_10 = 'Y';
                                            cStack_f = '\0';
                                            cStack_e = '\0';
                                            name[0] = '\0';
                                          }
                                          else {
                                            iVar1 = strcmp((char *)((long)&desc + 3),"AD07");
                                            if (iVar1 == 0) {
                                              cStack_10 = 'U';
                                              cStack_f = '\0';
                                              cStack_e = '\0';
                                              name[0] = '\0';
                                            }
                                            else {
                                              iVar1 = strcmp((char *)((long)&desc + 3),"AD08");
                                              if (iVar1 == 0) {
                                                cStack_10 = 'I';
                                                cStack_f = '\0';
                                                cStack_e = '\0';
                                                name[0] = '\0';
                                              }
                                              else {
                                                iVar1 = strcmp((char *)((long)&desc + 3),"AD09");
                                                if (iVar1 == 0) {
                                                  cStack_10 = 'O';
                                                  cStack_f = '\0';
                                                  cStack_e = '\0';
                                                  name[0] = '\0';
                                                }
                                                else {
                                                  iVar1 = strcmp((char *)((long)&desc + 3),"AD10");
                                                  if (iVar1 == 0) {
                                                    cStack_10 = 'P';
                                                    cStack_f = '\0';
                                                    cStack_e = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&desc + 3),"AD11")
                                                    ;
                                                    if (iVar1 == 0) {
                                                      cStack_10 = '[';
                                                      cStack_f = '\0';
                                                      cStack_e = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)((long)&desc + 3),
                                                                     "AD12");
                                                      if (iVar1 == 0) {
                                                        cStack_10 = ']';
                                                        cStack_f = '\0';
                                                        cStack_e = '\0';
                                                        name[0] = '\0';
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)((long)&desc + 3),
                                                                       "AC01");
                                                        if (iVar1 == 0) {
                                                          cStack_10 = 'A';
                                                          cStack_f = '\0';
                                                          cStack_e = '\0';
                                                          name[0] = '\0';
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)((long)&desc + 3),
                                                                         "AC02");
                                                          if (iVar1 == 0) {
                                                            cStack_10 = 'S';
                                                            cStack_f = '\0';
                                                            cStack_e = '\0';
                                                            name[0] = '\0';
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)((long)&desc + 3)
                                                                           ,"AC03");
                                                            if (iVar1 == 0) {
                                                              cStack_10 = 'D';
                                                              cStack_f = '\0';
                                                              cStack_e = '\0';
                                                              name[0] = '\0';
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)((long)&desc +
                                                                                     3),"AC04");
                                                              if (iVar1 == 0) {
                                                                cStack_10 = 'F';
                                                                cStack_f = '\0';
                                                                cStack_e = '\0';
                                                                name[0] = '\0';
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)((long)&desc
                                                                                       + 3),"AC05");
                                                                if (iVar1 == 0) {
                                                                  cStack_10 = 'G';
                                                                  cStack_f = '\0';
                                                                  cStack_e = '\0';
                                                                  name[0] = '\0';
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)((long)&
                                                  desc + 3),"AC06");
                                                  if (iVar1 == 0) {
                                                    cStack_10 = 'H';
                                                    cStack_f = '\0';
                                                    cStack_e = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&desc + 3),"AC07")
                                                    ;
                                                    if (iVar1 == 0) {
                                                      cStack_10 = 'J';
                                                      cStack_f = '\0';
                                                      cStack_e = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)((long)&desc + 3),
                                                                     "AC08");
                                                      if (iVar1 == 0) {
                                                        cStack_10 = 'K';
                                                        cStack_f = '\0';
                                                        cStack_e = '\0';
                                                        name[0] = '\0';
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)((long)&desc + 3),
                                                                       "AC09");
                                                        if (iVar1 == 0) {
                                                          cStack_10 = 'L';
                                                          cStack_f = '\0';
                                                          cStack_e = '\0';
                                                          name[0] = '\0';
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)((long)&desc + 3),
                                                                         "AC10");
                                                          if (iVar1 == 0) {
                                                            cStack_10 = ';';
                                                            cStack_f = '\0';
                                                            cStack_e = '\0';
                                                            name[0] = '\0';
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)((long)&desc + 3)
                                                                           ,"AC11");
                                                            if (iVar1 == 0) {
                                                              cStack_10 = '\'';
                                                              cStack_f = '\0';
                                                              cStack_e = '\0';
                                                              name[0] = '\0';
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)((long)&desc +
                                                                                     3),"AB01");
                                                              if (iVar1 == 0) {
                                                                cStack_10 = 'Z';
                                                                cStack_f = '\0';
                                                                cStack_e = '\0';
                                                                name[0] = '\0';
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)((long)&desc
                                                                                       + 3),"AB02");
                                                                if (iVar1 == 0) {
                                                                  cStack_10 = 'X';
                                                                  cStack_f = '\0';
                                                                  cStack_e = '\0';
                                                                  name[0] = '\0';
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)((long)&
                                                  desc + 3),"AB03");
                                                  if (iVar1 == 0) {
                                                    cStack_10 = 'C';
                                                    cStack_f = '\0';
                                                    cStack_e = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&desc + 3),"AB04")
                                                    ;
                                                    if (iVar1 == 0) {
                                                      cStack_10 = 'V';
                                                      cStack_f = '\0';
                                                      cStack_e = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      iVar1 = strcmp((char *)((long)&desc + 3),
                                                                     "AB05");
                                                      if (iVar1 == 0) {
                                                        cStack_10 = 'B';
                                                        cStack_f = '\0';
                                                        cStack_e = '\0';
                                                        name[0] = '\0';
                                                      }
                                                      else {
                                                        iVar1 = strcmp((char *)((long)&desc + 3),
                                                                       "AB06");
                                                        if (iVar1 == 0) {
                                                          cStack_10 = 'N';
                                                          cStack_f = '\0';
                                                          cStack_e = '\0';
                                                          name[0] = '\0';
                                                        }
                                                        else {
                                                          iVar1 = strcmp((char *)((long)&desc + 3),
                                                                         "AB07");
                                                          if (iVar1 == 0) {
                                                            cStack_10 = 'M';
                                                            cStack_f = '\0';
                                                            cStack_e = '\0';
                                                            name[0] = '\0';
                                                          }
                                                          else {
                                                            iVar1 = strcmp((char *)((long)&desc + 3)
                                                                           ,"AB08");
                                                            if (iVar1 == 0) {
                                                              cStack_10 = ',';
                                                              cStack_f = '\0';
                                                              cStack_e = '\0';
                                                              name[0] = '\0';
                                                            }
                                                            else {
                                                              iVar1 = strcmp((char *)((long)&desc +
                                                                                     3),"AB09");
                                                              if (iVar1 == 0) {
                                                                cStack_10 = '.';
                                                                cStack_f = '\0';
                                                                cStack_e = '\0';
                                                                name[0] = '\0';
                                                              }
                                                              else {
                                                                iVar1 = strcmp((char *)((long)&desc
                                                                                       + 3),"AB10");
                                                                if (iVar1 == 0) {
                                                                  cStack_10 = '/';
                                                                  cStack_f = '\0';
                                                                  cStack_e = '\0';
                                                                  name[0] = '\0';
                                                                }
                                                                else {
                                                                  iVar1 = strcmp((char *)((long)&
                                                  desc + 3),"BKSL");
                                                  if (iVar1 == 0) {
                                                    cStack_10 = '\\';
                                                    cStack_f = '\0';
                                                    cStack_e = '\0';
                                                    name[0] = '\0';
                                                  }
                                                  else {
                                                    iVar1 = strcmp((char *)((long)&desc + 3),"LSGT")
                                                    ;
                                                    if (iVar1 == 0) {
                                                      cStack_10 = -0x5f;
                                                      cStack_f = '\0';
                                                      cStack_e = '\0';
                                                      name[0] = '\0';
                                                    }
                                                    else {
                                                      cStack_10 = -1;
                                                      cStack_f = -1;
                                                      cStack_e = -1;
                                                      name[0] = -1;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((-1 < (int)name._1_4_) && ((int)name._1_4_ < 0x100)) {
        _glfw.x11.keycodes[(int)name._1_4_] = (short)_cStack_10;
      }
    }
    XkbFreeNames(lVar2,0x200,1);
    XkbFreeKeyboard(lVar2,0,1);
  }
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  for (; (int)name._1_4_ < 0x100; name._1_4_ = name._1_4_ + 1) {
    if (_glfw.x11.keycodes[(int)name._1_4_] < 0) {
      iVar1 = translateKeyCode(name._1_4_);
      _glfw.x11.keycodes[(int)name._1_4_] = (short)iVar1;
    }
    if (0 < _glfw.x11.keycodes[(int)name._1_4_]) {
      _glfw.x11.scancodes[_glfw.x11.keycodes[(int)name._1_4_]] = (short)name._1_4_;
    }
  }
  return;
}

Assistant:

static void createKeyTables(void)
{
    int scancode, key;

    memset(_glfw.x11.keycodes, -1, sizeof(_glfw.x11.keycodes));
    memset(_glfw.x11.scancodes, -1, sizeof(_glfw.x11.scancodes));

    if (_glfw.x11.xkb.available)
    {
        // Use XKB to determine physical key locations independently of the current
        // keyboard layout

        char name[XkbKeyNameLength + 1];
        XkbDescPtr desc = XkbGetMap(_glfw.x11.display, 0, XkbUseCoreKbd);
        XkbGetNames(_glfw.x11.display, XkbKeyNamesMask, desc);

        // Find the X11 key code -> GLFW key code mapping
        for (scancode = desc->min_key_code;  scancode <= desc->max_key_code;  scancode++)
        {
            memcpy(name, desc->names->keys[scancode].name, XkbKeyNameLength);
            name[XkbKeyNameLength] = '\0';

            // Map the key name to a GLFW key code. Note: We only map printable
            // keys here, and we use the US keyboard layout. The rest of the
            // keys (function keys) are mapped using traditional KeySym
            // translations.
            if (strcmp(name, "TLDE") == 0) key = GLFW_KEY_GRAVE_ACCENT;
            else if (strcmp(name, "AE01") == 0) key = GLFW_KEY_1;
            else if (strcmp(name, "AE02") == 0) key = GLFW_KEY_2;
            else if (strcmp(name, "AE03") == 0) key = GLFW_KEY_3;
            else if (strcmp(name, "AE04") == 0) key = GLFW_KEY_4;
            else if (strcmp(name, "AE05") == 0) key = GLFW_KEY_5;
            else if (strcmp(name, "AE06") == 0) key = GLFW_KEY_6;
            else if (strcmp(name, "AE07") == 0) key = GLFW_KEY_7;
            else if (strcmp(name, "AE08") == 0) key = GLFW_KEY_8;
            else if (strcmp(name, "AE09") == 0) key = GLFW_KEY_9;
            else if (strcmp(name, "AE10") == 0) key = GLFW_KEY_0;
            else if (strcmp(name, "AE11") == 0) key = GLFW_KEY_MINUS;
            else if (strcmp(name, "AE12") == 0) key = GLFW_KEY_EQUAL;
            else if (strcmp(name, "AD01") == 0) key = GLFW_KEY_Q;
            else if (strcmp(name, "AD02") == 0) key = GLFW_KEY_W;
            else if (strcmp(name, "AD03") == 0) key = GLFW_KEY_E;
            else if (strcmp(name, "AD04") == 0) key = GLFW_KEY_R;
            else if (strcmp(name, "AD05") == 0) key = GLFW_KEY_T;
            else if (strcmp(name, "AD06") == 0) key = GLFW_KEY_Y;
            else if (strcmp(name, "AD07") == 0) key = GLFW_KEY_U;
            else if (strcmp(name, "AD08") == 0) key = GLFW_KEY_I;
            else if (strcmp(name, "AD09") == 0) key = GLFW_KEY_O;
            else if (strcmp(name, "AD10") == 0) key = GLFW_KEY_P;
            else if (strcmp(name, "AD11") == 0) key = GLFW_KEY_LEFT_BRACKET;
            else if (strcmp(name, "AD12") == 0) key = GLFW_KEY_RIGHT_BRACKET;
            else if (strcmp(name, "AC01") == 0) key = GLFW_KEY_A;
            else if (strcmp(name, "AC02") == 0) key = GLFW_KEY_S;
            else if (strcmp(name, "AC03") == 0) key = GLFW_KEY_D;
            else if (strcmp(name, "AC04") == 0) key = GLFW_KEY_F;
            else if (strcmp(name, "AC05") == 0) key = GLFW_KEY_G;
            else if (strcmp(name, "AC06") == 0) key = GLFW_KEY_H;
            else if (strcmp(name, "AC07") == 0) key = GLFW_KEY_J;
            else if (strcmp(name, "AC08") == 0) key = GLFW_KEY_K;
            else if (strcmp(name, "AC09") == 0) key = GLFW_KEY_L;
            else if (strcmp(name, "AC10") == 0) key = GLFW_KEY_SEMICOLON;
            else if (strcmp(name, "AC11") == 0) key = GLFW_KEY_APOSTROPHE;
            else if (strcmp(name, "AB01") == 0) key = GLFW_KEY_Z;
            else if (strcmp(name, "AB02") == 0) key = GLFW_KEY_X;
            else if (strcmp(name, "AB03") == 0) key = GLFW_KEY_C;
            else if (strcmp(name, "AB04") == 0) key = GLFW_KEY_V;
            else if (strcmp(name, "AB05") == 0) key = GLFW_KEY_B;
            else if (strcmp(name, "AB06") == 0) key = GLFW_KEY_N;
            else if (strcmp(name, "AB07") == 0) key = GLFW_KEY_M;
            else if (strcmp(name, "AB08") == 0) key = GLFW_KEY_COMMA;
            else if (strcmp(name, "AB09") == 0) key = GLFW_KEY_PERIOD;
            else if (strcmp(name, "AB10") == 0) key = GLFW_KEY_SLASH;
            else if (strcmp(name, "BKSL") == 0) key = GLFW_KEY_BACKSLASH;
            else if (strcmp(name, "LSGT") == 0) key = GLFW_KEY_WORLD_1;
            else key = GLFW_KEY_UNKNOWN;

            if ((scancode >= 0) && (scancode < 256))
                _glfw.x11.keycodes[scancode] = key;
        }

        XkbFreeNames(desc, XkbKeyNamesMask, True);
        XkbFreeKeyboard(desc, 0, True);
    }

    for (scancode = 0;  scancode < 256;  scancode++)
    {
        // Translate the un-translated key codes using traditional X11 KeySym
        // lookups
        if (_glfw.x11.keycodes[scancode] < 0)
            _glfw.x11.keycodes[scancode] = translateKeyCode(scancode);

        // Store the reverse translation for faster key name lookup
        if (_glfw.x11.keycodes[scancode] > 0)
            _glfw.x11.scancodes[_glfw.x11.keycodes[scancode]] = scancode;
    }
}